

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

string * __thiscall
spectest::ExpectedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,spectest *this,ExpectedValue *ev)

{
  ExpectedNan EVar1;
  Enum EVar2;
  undefined8 uVar3;
  TypedValue *tv;
  ExpectedValue *ev_00;
  ExpectedValue local_c0;
  string local_90;
  int local_6c;
  allocator<char> local_66;
  undefined1 local_65;
  int lane;
  int local_5c;
  undefined1 local_58 [4];
  int lane_count;
  string local_38;
  ExpectedValue *local_18;
  ExpectedValue *ev_local;
  string *result;
  
  local_18 = (ExpectedValue *)this;
  ev_local = (ExpectedValue *)__return_storage_ptr__;
  EVar2 = wabt::Type::operator_cast_to_Enum((Type *)this);
  if (EVar2 == V128) {
    _lane = local_18->lane_type;
    local_5c = LaneCountFromType(_lane);
    local_65 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"v128 ",&local_66);
    std::allocator<char>::~allocator(&local_66);
    for (local_6c = 0; local_6c < local_5c; local_6c = local_6c + 1) {
      GetLane(&local_c0,local_18,local_6c);
      ExpectedValueToString_abi_cxx11_(&local_90,(spectest *)&local_c0,ev_00);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    return __return_storage_ptr__;
  }
  if (EVar2 == F64 || EVar2 == F32) {
    EVar1 = local_18->nan[0];
    if (EVar1 == None) {
      wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)local_18,tv);
      return __return_storage_ptr__;
    }
    if (EVar1 == Canonical) {
      wabt::Type::GetName_abi_cxx11_((string *)local_58,(Type *)local_18);
      uVar3 = std::__cxx11::string::c_str();
      wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:nan:canonical",uVar3);
      std::__cxx11::string::~string((string *)local_58);
      return __return_storage_ptr__;
    }
    if (EVar1 == Arithmetic) {
      wabt::Type::GetName_abi_cxx11_(&local_38,(Type *)local_18);
      uVar3 = std::__cxx11::string::c_str();
      wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:nan:arithmetic",uVar3);
      std::__cxx11::string::~string((string *)&local_38);
      return __return_storage_ptr__;
    }
  }
  wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)local_18,tv);
  return __return_storage_ptr__;
}

Assistant:

static std::string ExpectedValueToString(const ExpectedValue& ev) {
  // Extend TypedValueToString to print expected nan values too.
  switch (ev.value.type) {
    case Type::F32:
    case Type::F64:
      switch (ev.nan[0]) {
        case ExpectedNan::None:
          return TypedValueToString(ev.value);

        case ExpectedNan::Arithmetic:
          return StringPrintf("%s:nan:arithmetic",
                              ev.value.type.GetName().c_str());

        case ExpectedNan::Canonical:
          return StringPrintf("%s:nan:canonical",
                              ev.value.type.GetName().c_str());
      }
      break;

    case Type::V128: {
      int lane_count = LaneCountFromType(ev.lane_type);
      std::string result = "v128 ";
      for (int lane = 0; lane < lane_count; ++lane) {
        result += ExpectedValueToString(GetLane(ev, lane));
      }
      return result;
    }

    default:
      break;
  }
  return TypedValueToString(ev.value);
}